

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_AddTriangleFilled(ImDrawList *self,ImVec2 a,ImVec2 b,ImVec2 c,ImU32 col)

{
  ImU32 col_local;
  ImDrawList *self_local;
  ImVec2 c_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  self_local = (ImDrawList *)c;
  c_local = b;
  b_local = a;
  ImDrawList::AddTriangleFilled(self,&b_local,&c_local,(ImVec2 *)&self_local,col);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddTriangleFilled (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImVec2 const *larg4, ImU32 *larg5) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImVec2 arg4 ;
  ImU32 arg5 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  try {
    ImDrawList_AddTriangleFilled(arg1,arg2,arg3,arg4,arg5);
    
  } catch (...) {
    
  }
}